

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_b44.c
# Opt level: O2

uint64_t compute_scratch_buffer_size(exr_decode_pipeline_t *decode,uint64_t uncompressed_size)

{
  ushort uVar1;
  exr_coding_channel_info_t *peVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  
  uVar1 = decode->channel_count;
  lVar5 = 0;
  if ((short)uVar1 < 1) {
    uVar1 = 0;
  }
  uVar6 = 0;
  for (; (ulong)uVar1 * 0x30 - lVar5 != 0; lVar5 = lVar5 + 0x30) {
    peVar2 = decode->channels;
    iVar3 = *(int *)((long)&peVar2->width + lVar5);
    if (iVar3 % 4 != 0) {
      iVar3 = (iVar3 - iVar3 % 4) + 4;
    }
    iVar4 = *(int *)((long)&peVar2->height + lVar5);
    if (iVar4 % 4 != 0) {
      iVar4 = (iVar4 - iVar4 % 4) + 4;
    }
    uVar6 = uVar6 + (long)(&peVar2->bytes_per_element)[lVar5] * (long)iVar3 * (long)iVar4;
  }
  if (uncompressed_size < uVar6) {
    uncompressed_size = uVar6;
  }
  return uncompressed_size;
}

Assistant:

static uint64_t
compute_scratch_buffer_size (
    exr_decode_pipeline_t* decode, uint64_t uncompressed_size)
{
    const exr_coding_channel_info_t* curc;
    int                              nx, ny;
    uint64_t                         ret  = uncompressed_size;
    uint64_t                         comp = 0;

    for (int c = 0; c < decode->channel_count; ++c)
    {
        curc = decode->channels + c;

        nx = curc->width;
        ny = curc->height;

        if (nx % 4) nx += 4 - nx % 4;
        if (ny % 4) ny += 4 - ny % 4;

        comp += (uint64_t) (ny) * (uint64_t) (nx) *
                (uint64_t) (curc->bytes_per_element);
    }
    if (comp > ret) ret = comp;
    return ret;
}